

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int param_7)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  undefined2 uVar5;
  undefined8 uVar6;
  byte bVar7;
  short sVar8;
  stbi_uc sVar9;
  byte bVar10;
  int iVar11;
  stbi__uint32 sVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  stbi__jpeg *psVar16;
  byte *pbVar17;
  ulong uVar18;
  void *pvVar19;
  code *pcVar20;
  stbi_uc *psVar21;
  long lVar22;
  long lVar23;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar24;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar25;
  ulong extraout_RDX_02;
  stbi_uc *extraout_RDX_03;
  stbi_uc *psVar26;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  int iVar27;
  ulong uVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  short sVar34;
  stbi__uint32 sVar35;
  uint uVar36;
  short *psVar37;
  ushort *puVar38;
  int iVar39;
  uint uVar40;
  int *piVar41;
  stbi__context *psVar42;
  ulong uVar43;
  int *piVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_164;
  stbi_uc *local_158 [3];
  long local_140;
  int local_12c;
  stbi__uint32 *local_128;
  stbi__uint32 *local_120;
  int *local_118;
  int local_10c;
  anon_struct_96_18_0d0905d3 *local_108;
  long local_100;
  stbi__png local_f8;
  int local_d0 [40];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  local_128 = (stbi__uint32 *)x;
  local_120 = (stbi__uint32 *)y;
  local_118 = comp;
  psVar16 = (stbi__jpeg *)malloc(0x4888);
  psVar16->s = s;
  psVar16->idct_block_kernel = stbi__idct_simd;
  psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar16->jfif = 0;
  psVar16->app14_color_transform = -1;
  psVar16->marker = 0xff;
  sVar9 = stbi__get_marker(psVar16);
  if (sVar9 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar16);
  if (sVar9 == 0xd8) {
    psVar16 = (stbi__jpeg *)malloc(0x4888);
    psVar16->s = s;
    psVar16->idct_block_kernel = stbi__idct_simd;
    psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar16->img_comp[0].raw_data = (void *)0x0;
      psVar16->img_comp[0].raw_coeff = (void *)0x0;
      psVar16->img_comp[1].raw_data = (void *)0x0;
      psVar16->img_comp[1].raw_coeff = (void *)0x0;
      psVar16->img_comp[2].raw_data = (void *)0x0;
      psVar16->img_comp[2].raw_coeff = (void *)0x0;
      psVar16->img_comp[3].raw_data = (void *)0x0;
      psVar16->img_comp[3].raw_coeff = (void *)0x0;
      psVar16->restart_interval = 0;
      iVar11 = stbi__decode_jpeg_header(psVar16,0);
      uVar40 = extraout_EDX;
      if (iVar11 != 0) {
        paVar1 = psVar16->img_comp;
        bVar10 = stbi__get_marker(psVar16);
LAB_00102d4a:
        if (bVar10 == 0xda) {
          iVar11 = stbi__get16be(psVar16->s);
          psVar42 = psVar16->s;
          pbVar30 = psVar42->img_buffer;
          paVar25 = extraout_RDX_00;
          if (psVar42->img_buffer_end <= pbVar30) {
            if (psVar42->read_from_callbacks != 0) {
              psVar21 = psVar42->buffer_start;
              iVar32 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
              if (iVar32 == 0) {
                psVar42->read_from_callbacks = 0;
                psVar26 = psVar42->buffer_start + 1;
                psVar42->buffer_start[0] = '\0';
                bVar10 = 0;
              }
              else {
                psVar26 = psVar21 + iVar32;
                bVar10 = *psVar21;
              }
              psVar42->img_buffer_end = psVar26;
              psVar42->img_buffer = psVar42->buffer_start + 1;
              paVar25 = extraout_RDX_01;
              goto LAB_00102e30;
            }
            psVar16->scan_n = 0;
LAB_00104b7d:
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_00104b84;
          }
          psVar42->img_buffer = pbVar30 + 1;
          bVar10 = *pbVar30;
LAB_00102e30:
          uVar40 = (uint)bVar10;
          psVar16->scan_n = uVar40;
          if (((byte)(bVar10 - 5) < 0xfc) || (psVar42 = psVar16->s, psVar42->img_n < (int)uVar40))
          goto LAB_00104b7d;
          if (iVar11 != uVar40 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_00104b84;
          }
          lVar23 = 0;
          do {
            pbVar17 = psVar42->img_buffer;
            pbVar30 = psVar42->img_buffer_end;
            if (pbVar17 < pbVar30) {
              psVar42->img_buffer = pbVar17 + 1;
              uVar14 = (uint)*pbVar17;
              pbVar17 = pbVar17 + 1;
            }
            else if (psVar42->read_from_callbacks == 0) {
              uVar14 = 0;
            }
            else {
              psVar21 = psVar42->buffer_start;
              iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
              if (iVar11 == 0) {
                psVar42->read_from_callbacks = 0;
                psVar26 = psVar42->buffer_start + 1;
                psVar42->buffer_start[0] = '\0';
                uVar14 = 0;
              }
              else {
                psVar26 = psVar21 + iVar11;
                uVar14 = (uint)*psVar21;
              }
              psVar42->img_buffer_end = psVar26;
              psVar42->img_buffer = psVar42->buffer_start + 1;
              psVar42 = psVar16->s;
              pbVar17 = psVar42->img_buffer;
              pbVar30 = psVar42->img_buffer_end;
            }
            if (pbVar17 < pbVar30) {
              psVar42->img_buffer = pbVar17 + 1;
              uVar36 = (uint)*pbVar17;
            }
            else if (psVar42->read_from_callbacks == 0) {
              uVar36 = 0;
            }
            else {
              psVar21 = psVar42->buffer_start;
              iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
              if (iVar11 == 0) {
                psVar42->read_from_callbacks = 0;
                psVar26 = psVar42->buffer_start + 1;
                psVar42->buffer_start[0] = '\0';
                uVar36 = 0;
              }
              else {
                psVar26 = psVar21 + iVar11;
                uVar36 = (uint)*psVar21;
              }
              psVar42->img_buffer_end = psVar26;
              psVar42->img_buffer = psVar42->buffer_start + 1;
              psVar42 = psVar16->s;
            }
            uVar40 = psVar42->img_n;
            if ((long)(int)uVar40 < 1) {
              uVar28 = 0;
            }
            else {
              uVar28 = 0;
              paVar25 = paVar1;
              while (paVar25->id != uVar14) {
                uVar28 = uVar28 + 1;
                paVar25 = paVar25 + 1;
                if ((long)(int)uVar40 == uVar28) goto LAB_00104b8b;
              }
            }
            if ((uint)uVar28 == uVar40) goto LAB_00104b8b;
            uVar18 = uVar28 & 0xffffffff;
            paVar25 = (anon_struct_96_18_0d0905d3 *)(uVar18 * 0x60);
            psVar16->img_comp[uVar18].hd = uVar36 >> 4;
            if (0x3f < (byte)uVar36) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_00104b84;
            }
            paVar25 = paVar1 + uVar18;
            paVar25->ha = uVar36 & 0xf;
            if (3 < (uVar36 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_00104b84;
            }
            psVar16->order[lVar23] = (uint)uVar28;
            lVar23 = lVar23 + 1;
          } while (lVar23 < psVar16->scan_n);
          pbVar30 = psVar42->img_buffer;
          pbVar17 = psVar42->img_buffer_end;
          if (pbVar30 < pbVar17) {
            psVar42->img_buffer = pbVar30 + 1;
            bVar10 = *pbVar30;
            pbVar30 = pbVar30 + 1;
          }
          else if (psVar42->read_from_callbacks == 0) {
            bVar10 = 0;
          }
          else {
            psVar21 = psVar42->buffer_start;
            iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
            if (iVar11 == 0) {
              psVar42->read_from_callbacks = 0;
              psVar26 = psVar42->buffer_start + 1;
              psVar42->buffer_start[0] = '\0';
              bVar10 = 0;
            }
            else {
              psVar26 = psVar21 + iVar11;
              bVar10 = *psVar21;
            }
            psVar42->img_buffer_end = psVar26;
            psVar42->img_buffer = psVar42->buffer_start + 1;
            psVar42 = psVar16->s;
            pbVar30 = psVar42->img_buffer;
            pbVar17 = psVar42->img_buffer_end;
          }
          psVar16->spec_start = (uint)bVar10;
          if (pbVar30 < pbVar17) {
            psVar42->img_buffer = pbVar30 + 1;
            uVar40 = (uint)*pbVar30;
            pbVar30 = pbVar30 + 1;
          }
          else if (psVar42->read_from_callbacks == 0) {
            uVar40 = 0;
          }
          else {
            psVar21 = psVar42->buffer_start;
            iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
            if (iVar11 == 0) {
              psVar42->read_from_callbacks = 0;
              psVar26 = psVar42->buffer_start + 1;
              psVar42->buffer_start[0] = '\0';
              uVar40 = 0;
            }
            else {
              psVar26 = psVar21 + iVar11;
              uVar40 = (uint)*psVar21;
            }
            psVar42->img_buffer_end = psVar26;
            psVar42->img_buffer = psVar42->buffer_start + 1;
            psVar42 = psVar16->s;
            pbVar30 = psVar42->img_buffer;
            pbVar17 = psVar42->img_buffer_end;
          }
          psVar16->spec_end = uVar40;
          if (pbVar30 < pbVar17) {
            psVar42->img_buffer = pbVar30 + 1;
            uVar40 = (uint)*pbVar30;
          }
          else if (psVar42->read_from_callbacks == 0) {
            uVar40 = 0;
          }
          else {
            psVar21 = psVar42->buffer_start;
            iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
            if (iVar11 == 0) {
              psVar42->read_from_callbacks = 0;
              psVar26 = psVar42->buffer_start + 1;
              psVar42->buffer_start[0] = '\0';
              uVar40 = 0;
            }
            else {
              psVar26 = psVar21 + iVar11;
              uVar40 = (uint)*psVar21;
            }
            psVar42->img_buffer_end = psVar26;
            psVar42->img_buffer = psVar42->buffer_start + 1;
          }
          psVar16->succ_high = uVar40 >> 4;
          uVar14 = uVar40 & 0xf;
          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
          psVar16->succ_low = uVar14;
          iVar11 = psVar16->progressive;
          iVar32 = psVar16->spec_start;
          if (iVar11 == 0) {
            if ((iVar32 != 0) || ((0xf < (byte)uVar40 || (uVar14 != 0)))) {
LAB_00104bc9:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_00104b84;
            }
            psVar16->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar32) || (0x3f < psVar16->spec_end)) || (psVar16->spec_end < iVar32))
                  || ((0xdf < (byte)uVar40 || (0xd < uVar14)))) goto LAB_00104bc9;
          uVar40 = psVar16->scan_n;
          uVar28 = (ulong)uVar40;
          iVar32 = psVar16->restart_interval;
          if (iVar32 == 0) {
            iVar32 = 0x7fffffff;
          }
          psVar16->code_buffer = 0;
          psVar16->code_bits = 0;
          psVar16->nomore = 0;
          psVar16->img_comp[3].dc_pred = 0;
          psVar16->img_comp[2].dc_pred = 0;
          psVar16->img_comp[1].dc_pred = 0;
          psVar16->img_comp[0].dc_pred = 0;
          psVar16->marker = 0xff;
          psVar16->todo = iVar32;
          psVar16->eob_run = 0;
          if (iVar11 == 0) {
            if (uVar40 == 1) {
              iVar11 = psVar16->order[0];
              iVar32 = psVar16->img_comp[iVar11].y + 7 >> 3;
              bVar45 = true;
              uVar40 = 1;
              if (0 < iVar32) {
                uVar14 = paVar1[iVar11].x + 7 >> 3;
                iVar15 = 0;
                iVar39 = 0;
                do {
                  if (0 < (int)uVar14) {
                    lVar23 = 0;
                    do {
                      iVar27 = stbi__jpeg_decode_block
                                         (psVar16,(short *)&local_f8,
                                          psVar16->huff_dc + paVar1[iVar11].hd,
                                          psVar16->huff_ac + paVar1[iVar11].ha,
                                          psVar16->fast_ac[paVar1[iVar11].ha],iVar11,
                                          psVar16->dequant[paVar1[iVar11].tq]);
                      uVar40 = extraout_EDX_02;
                      if (iVar27 == 0) goto LAB_0010407b;
                      (*psVar16->idct_block_kernel)
                                (paVar1[iVar11].data + lVar23 + iVar15 * paVar1[iVar11].w2,
                                 paVar1[iVar11].w2,(short *)&local_f8);
                      uVar40 = (uint)extraout_RDX_02;
                      iVar27 = psVar16->todo;
                      psVar16->todo = iVar27 + -1;
                      uVar28 = extraout_RDX_02;
                      if (iVar27 < 2) {
                        if (psVar16->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar16);
                          uVar40 = extraout_EDX_03;
                        }
                        if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_00104074;
                        psVar16->code_buffer = 0;
                        psVar16->code_bits = 0;
                        psVar16->nomore = 0;
                        psVar16->img_comp[3].dc_pred = 0;
                        psVar16->img_comp[2].dc_pred = 0;
                        psVar16->img_comp[1].dc_pred = 0;
                        psVar16->img_comp[0].dc_pred = 0;
                        psVar16->marker = 0xff;
                        iVar27 = psVar16->restart_interval;
                        uVar28 = 0x7fffffff;
                        if (iVar27 == 0) {
                          iVar27 = 0x7fffffff;
                        }
                        psVar16->todo = iVar27;
                        psVar16->eob_run = 0;
                      }
                      lVar23 = lVar23 + 8;
                    } while ((ulong)uVar14 * 8 != lVar23);
                  }
                  uVar40 = (uint)uVar28;
                  iVar39 = iVar39 + 1;
                  iVar15 = iVar15 + 8;
                } while (iVar39 != iVar32);
LAB_00104074:
                bVar45 = true;
              }
            }
            else {
              uVar40 = psVar16->img_mcu_y;
              uVar28 = (ulong)uVar40;
              bVar45 = true;
              if (0 < (int)uVar40) {
                iVar11 = psVar16->img_mcu_x;
                iVar39 = 0;
                do {
                  if (0 < iVar11) {
                    uVar14 = 0;
                    do {
                      iVar11 = psVar16->scan_n;
                      if (0 < iVar11) {
                        uVar28 = 0;
                        do {
                          iVar32 = psVar16->order[uVar28];
                          iVar15 = psVar16->img_comp[iVar32].v;
                          if (0 < iVar15) {
                            iVar11 = paVar1[iVar32].h;
                            iVar27 = 0;
                            do {
                              if (0 < iVar11) {
                                iVar15 = 0;
                                do {
                                  iVar31 = paVar1[iVar32].v;
                                  iVar13 = stbi__jpeg_decode_block
                                                     (psVar16,(short *)&local_f8,
                                                      psVar16->huff_dc + paVar1[iVar32].hd,
                                                      psVar16->huff_ac + paVar1[iVar32].ha,
                                                      psVar16->fast_ac[paVar1[iVar32].ha],iVar32,
                                                      psVar16->dequant[paVar1[iVar32].tq]);
                                  uVar40 = extraout_EDX_05;
                                  if (iVar13 == 0) goto LAB_0010407b;
                                  (*psVar16->idct_block_kernel)
                                            (paVar1[iVar32].data +
                                             (long)(int)((iVar11 * uVar14 + iVar15) * 8) +
                                             (long)((iVar31 * iVar39 + iVar27) * paVar1[iVar32].w2 *
                                                   8),paVar1[iVar32].w2,(short *)&local_f8);
                                  iVar15 = iVar15 + 1;
                                  iVar11 = paVar1[iVar32].h;
                                } while (iVar15 < iVar11);
                                iVar15 = paVar1[iVar32].v;
                              }
                              iVar27 = iVar27 + 1;
                            } while (iVar27 < iVar15);
                            iVar11 = psVar16->scan_n;
                          }
                          uVar28 = uVar28 + 1;
                        } while ((long)uVar28 < (long)iVar11);
                        iVar32 = psVar16->todo;
                      }
                      uVar40 = (uint)uVar28;
                      psVar16->todo = iVar32 + -1;
                      bVar45 = iVar32 < 2;
                      iVar32 = iVar32 + -1;
                      if (bVar45) {
                        if (psVar16->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar16);
                          uVar40 = extraout_EDX_06;
                        }
                        if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_00104074;
                        psVar16->code_buffer = 0;
                        psVar16->code_bits = 0;
                        psVar16->nomore = 0;
                        psVar16->img_comp[3].dc_pred = 0;
                        psVar16->img_comp[2].dc_pred = 0;
                        psVar16->img_comp[1].dc_pred = 0;
                        psVar16->img_comp[0].dc_pred = 0;
                        psVar16->marker = 0xff;
                        iVar32 = psVar16->restart_interval;
                        if (iVar32 == 0) {
                          iVar32 = 0x7fffffff;
                        }
                        psVar16->todo = iVar32;
                        psVar16->eob_run = 0;
                      }
                      uVar14 = uVar14 + 1;
                      uVar28 = (ulong)uVar14;
                      iVar11 = psVar16->img_mcu_x;
                    } while ((int)uVar14 < iVar11);
                    uVar28 = (ulong)(uint)psVar16->img_mcu_y;
                  }
                  iVar39 = iVar39 + 1;
                  uVar40 = (uint)uVar28;
                } while (iVar39 < (int)uVar40);
                goto LAB_00104074;
              }
            }
            goto LAB_0010407d;
          }
          if (uVar40 == 1) {
            local_100 = (long)psVar16->order[0];
            local_10c = psVar16->img_comp[local_100].y + 7 >> 3;
            if (0 < local_10c) {
              local_108 = paVar1 + local_100;
              local_12c = psVar16->img_comp[local_100].x + 7 >> 3;
              local_164 = 0;
              do {
                if (0 < local_12c) {
                  iVar11 = 0;
                  do {
                    psVar37 = local_108->coeff + (local_108->coeff_w * local_164 + iVar11) * 0x40;
                    uVar28 = (ulong)psVar16->spec_start;
                    if (uVar28 == 0) {
                      iVar32 = stbi__jpeg_decode_block_prog_dc
                                         (psVar16,psVar37,psVar16->huff_dc + local_108->hd,
                                          (int)local_100);
                      uVar40 = extraout_EDX_01;
                      if (iVar32 == 0) goto LAB_00104b8b;
                    }
                    else {
                      iVar32 = local_108->ha;
                      iVar39 = psVar16->eob_run;
                      bVar10 = (byte)psVar16->succ_low;
                      if (psVar16->succ_high == 0) {
                        if (iVar39 == 0) {
                          paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar16->code_bits;
                          do {
                            if ((int)paVar25 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar16);
                            }
                            uVar40 = psVar16->code_buffer;
                            uVar18 = (ulong)(uVar40 >> 0x17);
                            sVar34 = psVar16->fast_ac[iVar32][uVar18];
                            uVar14 = (uint)sVar34;
                            iVar39 = (int)uVar28;
                            if (sVar34 == 0) {
                              if (psVar16->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar16);
                                uVar40 = psVar16->code_buffer;
                                uVar18 = (ulong)(uVar40 >> 0x17);
                              }
                              uVar28 = (ulong)psVar16->huff_ac[iVar32].fast[uVar18];
                              if (uVar28 == 0xff) {
                                lVar23 = 0;
                                do {
                                  lVar22 = lVar23;
                                  lVar23 = lVar22 + 1;
                                } while (psVar16->huff_ac[iVar32].maxcode[lVar22 + 10] <=
                                         uVar40 >> 0x10);
                                uVar14 = psVar16->code_bits;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                                if (lVar23 == 8) goto LAB_0010542e;
                                if ((int)uVar14 < (int)(lVar22 + 10)) goto LAB_00105439;
                                uVar36 = stbi__bmask[lVar22 + 10];
                                iVar15 = psVar16->huff_ac[iVar32].delta[lVar22 + 10];
                                sVar12 = uVar40 << ((byte)(lVar22 + 10) & 0x1f);
                                uVar14 = (uVar14 - (int)lVar23) - 9;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                                psVar16->code_bits = uVar14;
                                psVar16->code_buffer = sVar12;
                                uVar28 = (ulong)(int)((uVar40 >> (0x17U - (char)lVar23 & 0x1f) &
                                                      uVar36) + iVar15);
                              }
                              else {
                                bVar2 = psVar16->huff_ac[iVar32].size[uVar28];
                                uVar14 = psVar16->code_bits - (uint)bVar2;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                                if (psVar16->code_bits < (int)(uint)bVar2) goto LAB_00105439;
                                sVar12 = uVar40 << (bVar2 & 0x1f);
                                psVar16->code_buffer = sVar12;
                                psVar16->code_bits = uVar14;
                              }
                              bVar2 = psVar16->huff_ac[iVar32].values[uVar28];
                              uVar40 = bVar2 & 0xf;
                              bVar7 = bVar2 >> 4;
                              uVar14 = (uint)bVar7;
                              iVar15 = (int)paVar25;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar39 = 1 << bVar7;
                                  psVar16->eob_run = iVar39;
                                  if (0xf < bVar2) {
                                    if (iVar15 < (int)uVar14) {
                                      stbi__grow_buffer_unsafe(psVar16);
                                      sVar12 = psVar16->code_buffer;
                                      iVar15 = psVar16->code_bits;
                                      iVar39 = psVar16->eob_run;
                                    }
                                    uVar36 = sVar12 << bVar7 | sVar12 >> 0x20 - bVar7;
                                    uVar40 = stbi__bmask[uVar14];
                                    psVar16->code_buffer = ~uVar40 & uVar36;
                                    iVar39 = iVar39 + (uVar36 & uVar40);
                                    psVar16->code_bits = iVar15 - uVar14;
                                  }
                                  goto LAB_00103453;
                                }
                                uVar40 = iVar39 + 0x10;
                              }
                              else {
                                lVar23 = (long)iVar39 + (ulong)uVar14;
                                bVar2 = ""[lVar23];
                                if (iVar15 < (int)uVar40) {
                                  stbi__grow_buffer_unsafe(psVar16);
                                  sVar12 = psVar16->code_buffer;
                                  iVar15 = psVar16->code_bits;
                                }
                                uVar36 = sVar12 << (sbyte)uVar40 | sVar12 >> 0x20 - (sbyte)uVar40;
                                uVar14 = *(uint *)((long)stbi__bmask + (ulong)(uVar40 * 4));
                                psVar16->code_buffer = ~uVar14 & uVar36;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar15 - uVar40);
                                psVar16->code_bits = iVar15 - uVar40;
                                iVar39 = 0;
                                if (-1 < (int)sVar12) {
                                  iVar39 = *(int *)((long)stbi__jbias + (ulong)(uVar40 * 4));
                                }
                                uVar40 = (int)lVar23 + 1;
                                psVar37[bVar2] =
                                     (short)((uVar14 & uVar36) + iVar39 << (bVar10 & 0x1f));
                              }
                            }
                            else {
                              lVar23 = (long)iVar39 + (ulong)(uVar14 >> 4 & 0xf);
                              psVar16->code_buffer = uVar40 << (sbyte)(uVar14 & 0xf);
                              uVar40 = psVar16->code_bits - (uVar14 & 0xf);
                              paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar40;
                              psVar16->code_bits = uVar40;
                              uVar40 = (int)lVar23 + 1;
                              psVar37[""[lVar23]] = (short)((uVar14 >> 8) << (bVar10 & 0x1f));
                            }
                            uVar28 = (ulong)uVar40;
                          } while ((int)uVar40 <= psVar16->spec_end);
                        }
                        else {
LAB_00103453:
                          psVar16->eob_run = iVar39 + -1;
                        }
                      }
                      else if (iVar39 == 0) {
                        iVar39 = 0x10000 << (bVar10 & 0x1f);
                        paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar16->code_bits;
                        do {
                          if ((int)paVar25 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar16);
                          }
                          uVar40 = psVar16->code_buffer;
                          uVar18 = (ulong)psVar16->huff_ac[iVar32].fast[uVar40 >> 0x17];
                          if (uVar18 == 0xff) {
                            lVar23 = 0;
                            do {
                              lVar22 = lVar23;
                              lVar23 = lVar22 + 1;
                            } while (psVar16->huff_ac[iVar32].maxcode[lVar22 + 10] <= uVar40 >> 0x10
                                    );
                            uVar14 = psVar16->code_bits;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                            if (lVar23 == 8) goto LAB_0010542e;
                            if ((int)uVar14 < (int)(lVar22 + 10)) goto LAB_00105439;
                            uVar36 = stbi__bmask[lVar22 + 10];
                            iVar15 = psVar16->huff_ac[iVar32].delta[lVar22 + 10];
                            sVar12 = uVar40 << ((byte)(lVar22 + 10) & 0x1f);
                            uVar14 = (uVar14 - (int)lVar23) - 9;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                            psVar16->code_bits = uVar14;
                            psVar16->code_buffer = sVar12;
                            uVar18 = (ulong)(int)((uVar40 >> (0x17U - (char)lVar23 & 0x1f) & uVar36)
                                                 + iVar15);
                          }
                          else {
                            bVar2 = psVar16->huff_ac[iVar32].size[uVar18];
                            uVar14 = psVar16->code_bits - (uint)bVar2;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar14;
                            if (psVar16->code_bits < (int)(uint)bVar2) goto LAB_00105439;
                            sVar12 = uVar40 << (bVar2 & 0x1f);
                            psVar16->code_buffer = sVar12;
                            psVar16->code_bits = uVar14;
                          }
                          iVar15 = (int)paVar25;
                          bVar2 = psVar16->huff_ac[iVar32].values[uVar18];
                          bVar7 = bVar2 >> 4;
                          uVar40 = (uint)bVar7;
                          uVar18 = (ulong)uVar40;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar15 < 1) {
                              stbi__grow_buffer_unsafe(psVar16);
                              sVar12 = psVar16->code_buffer;
                              iVar15 = psVar16->code_bits;
                            }
                            sVar35 = sVar12 * 2;
                            psVar16->code_buffer = sVar35;
                            paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar15 - 1U);
                            sVar34 = (short)(((int)~sVar12 >> 0x1f | 1U) << (bVar10 & 0x1f));
                            psVar16->code_bits = iVar15 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_00105439;
                            if (bVar2 < 0xf0) {
                              uVar14 = ~(-1 << bVar7);
                              psVar16->eob_run = uVar14;
                              uVar33 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar15 < (int)uVar40) {
                                  stbi__grow_buffer_unsafe(psVar16);
                                  sVar12 = psVar16->code_buffer;
                                  iVar15 = psVar16->code_bits;
                                  uVar14 = psVar16->eob_run;
                                }
                                uVar24 = sVar12 << bVar7 | sVar12 >> 0x20 - bVar7;
                                uVar36 = stbi__bmask[uVar18];
                                sVar35 = ~uVar36 & uVar24;
                                psVar16->code_buffer = sVar35;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar15 - uVar40);
                                psVar16->code_bits = iVar15 - uVar40;
                                psVar16->eob_run = (uVar24 & uVar36) + uVar14;
                                sVar34 = 0;
                                uVar18 = uVar33;
                                goto LAB_00103661;
                              }
                            }
                            else {
                              uVar33 = 0xf;
                            }
                            sVar34 = 0;
                            uVar18 = uVar33;
                            sVar35 = sVar12;
                          }
LAB_00103661:
                          uVar40 = psVar16->spec_end;
                          uVar33 = (ulong)uVar40;
                          if ((int)uVar28 <= (int)uVar40) {
                            uVar43 = (long)(int)uVar28;
                            do {
                              uVar40 = (uint)uVar33;
                              iVar15 = (int)paVar25;
                              bVar2 = ""[uVar43];
                              if (psVar37[bVar2] == 0) {
                                if ((int)uVar18 == 0) {
                                  uVar28 = (ulong)((int)uVar43 + 1);
                                  psVar37[bVar2] = sVar34;
                                  break;
                                }
                                uVar18 = (ulong)((int)uVar18 - 1);
                              }
                              else {
                                if (iVar15 < 1) {
                                  stbi__grow_buffer_unsafe(psVar16);
                                  sVar35 = psVar16->code_buffer;
                                  iVar15 = psVar16->code_bits;
                                }
                                sVar12 = sVar35 * 2;
                                psVar16->code_buffer = sVar12;
                                paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar15 - 1U);
                                psVar16->code_bits = iVar15 - 1U;
                                bVar45 = (int)sVar35 < 0;
                                sVar35 = sVar12;
                                if ((bVar45) &&
                                   (sVar3 = psVar37[bVar2], (iVar39 >> 0x10 & (int)sVar3) == 0)) {
                                  sVar8 = (short)((uint)iVar39 >> 0x10);
                                  if (sVar3 < 1) {
                                    sVar8 = -sVar8;
                                  }
                                  psVar37[bVar2] = sVar3 + sVar8;
                                }
                              }
                              uVar28 = uVar43 + 1;
                              uVar40 = psVar16->spec_end;
                              uVar33 = (ulong)(int)uVar40;
                              bVar45 = (long)uVar43 < (long)uVar33;
                              uVar43 = uVar28;
                            } while (bVar45);
                          }
                        } while ((int)uVar28 <= (int)uVar40);
                      }
                      else {
                        psVar16->eob_run = iVar39 + -1;
                        if (psVar16->spec_start <= psVar16->spec_end) {
                          uVar40 = (0x10000 << (bVar10 & 0x1f)) >> 0x10;
                          do {
                            bVar10 = ""[uVar28];
                            if (psVar37[bVar10] != 0) {
                              iVar32 = psVar16->code_bits;
                              if (iVar32 < 1) {
                                stbi__grow_buffer_unsafe(psVar16);
                                iVar32 = psVar16->code_bits;
                              }
                              sVar12 = psVar16->code_buffer;
                              psVar16->code_buffer = sVar12 * 2;
                              psVar16->code_bits = iVar32 + -1;
                              if (((int)sVar12 < 0) &&
                                 (sVar34 = psVar37[bVar10], (uVar40 & (int)sVar34) == 0)) {
                                uVar14 = -uVar40;
                                if (0 < sVar34) {
                                  uVar14 = uVar40;
                                }
                                psVar37[bVar10] = (short)uVar14 + sVar34;
                              }
                            }
                            bVar45 = (long)uVar28 < (long)psVar16->spec_end;
                            uVar28 = uVar28 + 1;
                          } while (bVar45);
                        }
                      }
                    }
                    iVar32 = psVar16->todo;
                    psVar16->todo = iVar32 + -1;
                    if (iVar32 < 2) {
                      if (psVar16->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar16);
                      }
                      bVar10 = psVar16->marker;
                      if ((bVar10 & 0xf8) != 0xd0) goto LAB_0010408d;
                      psVar16->code_buffer = 0;
                      psVar16->code_bits = 0;
                      psVar16->nomore = 0;
                      psVar16->img_comp[3].dc_pred = 0;
                      psVar16->img_comp[2].dc_pred = 0;
                      psVar16->img_comp[1].dc_pred = 0;
                      psVar16->img_comp[0].dc_pred = 0;
                      psVar16->marker = 0xff;
                      iVar32 = psVar16->restart_interval;
                      if (iVar32 == 0) {
                        iVar32 = 0x7fffffff;
                      }
                      psVar16->todo = iVar32;
                      psVar16->eob_run = 0;
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != local_12c);
                }
                local_164 = local_164 + 1;
              } while (local_164 != local_10c);
            }
          }
          else {
            iVar11 = psVar16->img_mcu_y;
            if (0 < iVar11) {
              iVar39 = psVar16->img_mcu_x;
              iVar15 = 0;
              do {
                if (0 < iVar39) {
                  iVar11 = 0;
                  do {
                    iVar39 = psVar16->scan_n;
                    if (0 < iVar39) {
                      lVar23 = 0;
                      do {
                        iVar32 = psVar16->order[lVar23];
                        iVar27 = psVar16->img_comp[iVar32].v;
                        if (0 < iVar27) {
                          iVar39 = paVar1[iVar32].h;
                          iVar31 = 0;
                          do {
                            if (0 < iVar39) {
                              iVar27 = 0;
                              do {
                                iVar39 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar16,paVar1[iVar32].coeff +
                                                            (iVar39 * iVar11 + iVar27 +
                                                            (paVar1[iVar32].v * iVar15 + iVar31) *
                                                            paVar1[iVar32].coeff_w) * 0x40,
                                                    psVar16->huff_dc + paVar1[iVar32].hd,iVar32);
                                uVar40 = extraout_EDX_04;
                                if (iVar39 == 0) goto LAB_00104b8b;
                                iVar27 = iVar27 + 1;
                                iVar39 = paVar1[iVar32].h;
                              } while (iVar27 < iVar39);
                              iVar27 = paVar1[iVar32].v;
                            }
                            iVar31 = iVar31 + 1;
                          } while (iVar31 < iVar27);
                          iVar39 = psVar16->scan_n;
                        }
                        lVar23 = lVar23 + 1;
                      } while (lVar23 < iVar39);
                      iVar32 = psVar16->todo;
                    }
                    psVar16->todo = iVar32 + -1;
                    bVar45 = iVar32 < 2;
                    iVar32 = iVar32 + -1;
                    if (bVar45) {
                      if (psVar16->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar16);
                      }
                      bVar10 = psVar16->marker;
                      if ((bVar10 & 0xf8) != 0xd0) goto LAB_0010408d;
                      psVar16->code_buffer = 0;
                      psVar16->code_bits = 0;
                      psVar16->nomore = 0;
                      psVar16->img_comp[3].dc_pred = 0;
                      psVar16->img_comp[2].dc_pred = 0;
                      psVar16->img_comp[1].dc_pred = 0;
                      psVar16->img_comp[0].dc_pred = 0;
                      psVar16->marker = 0xff;
                      iVar32 = psVar16->restart_interval;
                      if (iVar32 == 0) {
                        iVar32 = 0x7fffffff;
                      }
                      psVar16->todo = iVar32;
                      psVar16->eob_run = 0;
                    }
                    iVar11 = iVar11 + 1;
                    iVar39 = psVar16->img_mcu_x;
                  } while (iVar11 < iVar39);
                  iVar11 = psVar16->img_mcu_y;
                }
                iVar15 = iVar15 + 1;
              } while (iVar15 < iVar11);
            }
          }
          goto LAB_00104085;
        }
        uVar40 = (uint)bVar10;
        if (uVar40 == 0xdc) {
          iVar11 = stbi__get16be(psVar16->s);
          sVar12 = stbi__get16be(psVar16->s);
          paVar25 = extraout_RDX;
          if (iVar11 == 4) {
            if (sVar12 == psVar16->s->img_y) goto LAB_00102da0;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_00104b84;
        }
        if (uVar40 == 0xd9) {
          psVar42 = psVar16->s;
          uVar40 = psVar42->img_n;
          if (psVar16->progressive == 0) goto LAB_00104b0c;
          if ((int)uVar40 < 1) {
            uVar14 = req_comp + (uint)(req_comp == 0);
            bVar45 = false;
          }
          else {
            lVar23 = 0;
            do {
              iVar11 = psVar16->img_comp[lVar23].y + 7 >> 3;
              if (0 < iVar11) {
                uVar40 = paVar1[lVar23].x + 7 >> 3;
                iVar32 = 0;
                do {
                  if (0 < (int)uVar40) {
                    uVar28 = 0;
                    do {
                      psVar37 = paVar1[lVar23].coeff +
                                (paVar1[lVar23].coeff_w * iVar32 + (int)uVar28) * 0x40;
                      iVar39 = paVar1[lVar23].tq;
                      lVar22 = 0;
                      do {
                        psVar37[lVar22] = psVar37[lVar22] * psVar16->dequant[iVar39][lVar22];
                        lVar22 = lVar22 + 1;
                      } while (lVar22 != 0x40);
                      (*psVar16->idct_block_kernel)
                                (paVar1[lVar23].data +
                                 uVar28 * 8 + (long)(iVar32 * 8 * paVar1[lVar23].w2),
                                 paVar1[lVar23].w2,psVar37);
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != uVar40);
                  }
                  iVar32 = iVar32 + 1;
                } while (iVar32 != iVar11);
                psVar42 = psVar16->s;
              }
              lVar23 = lVar23 + 1;
              uVar40 = psVar42->img_n;
            } while (lVar23 < (int)uVar40);
LAB_00104b0c:
            uVar14 = (2 < (int)uVar40) + 1 + (uint)(2 < (int)uVar40);
            if (req_comp != 0) {
              uVar14 = req_comp;
            }
            uVar36 = uVar40;
            if (uVar40 == 3) {
              bVar45 = true;
              uVar40 = 3;
              if (psVar16->rgb != 3) {
                uVar36 = 3;
                if (psVar16->app14_color_transform != 0) goto LAB_00104b4f;
                bVar45 = psVar16->jfif == 0;
              }
            }
            else {
LAB_00104b4f:
              uVar40 = uVar36;
              bVar45 = false;
            }
          }
          uVar36 = 1;
          if (bVar45) {
            uVar36 = uVar40;
          }
          if (uVar40 != 3) {
            uVar36 = uVar40;
          }
          if (2 < (int)uVar14) {
            uVar36 = uVar40;
          }
          sVar12 = psVar42->img_x;
          if (0 < (int)uVar36) {
            lVar23 = 0;
            while( true ) {
              pvVar19 = malloc((ulong)(sVar12 + 3));
              *(void **)((long)&psVar16->img_comp[0].linebuf + lVar23 * 2) = pvVar19;
              iVar11 = extraout_EDX_07;
              if (pvVar19 == (void *)0x0) break;
              uVar28 = (long)psVar16->img_h_max /
                       (long)*(int *)((long)&psVar16->img_comp[0].h + lVar23 * 2);
              iVar11 = (int)uVar28;
              *(int *)((long)local_d0 + lVar23 + -0x10) = iVar11;
              iVar32 = psVar16->img_v_max / *(int *)((long)&psVar16->img_comp[0].v + lVar23 * 2);
              *(int *)((long)local_d0 + lVar23 + -0xc) = iVar32;
              *(int *)((long)local_d0 + lVar23 + -4) = iVar32 >> 1;
              *(int *)((long)local_d0 + lVar23 + -8) =
                   (int)((ulong)((sVar12 - 1) + iVar11) / (uVar28 & 0xffffffff));
              *(undefined4 *)((long)local_d0 + lVar23) = 0;
              uVar6 = *(undefined8 *)((long)&psVar16->img_comp[0].data + lVar23 * 2);
              *(undefined8 *)((long)local_d0 + lVar23 + -0x18) = uVar6;
              *(undefined8 *)((long)local_d0 + lVar23 + -0x20) = uVar6;
              if (iVar11 == 2) {
                pcVar20 = stbi__resample_row_h_2;
                if (iVar32 != 1) {
                  if (iVar32 != 2) goto LAB_00104d07;
                  pcVar20 = psVar16->resample_row_hv_2_kernel;
                }
              }
              else if (iVar11 == 1) {
                pcVar20 = stbi__resample_row_generic;
                if (iVar32 == 2) {
                  pcVar20 = stbi__resample_row_v_2;
                }
                if (iVar32 == 1) {
                  pcVar20 = resample_row_1;
                }
              }
              else {
LAB_00104d07:
                pcVar20 = stbi__resample_row_generic;
              }
              *(code **)((long)&local_f8.s + lVar23) = pcVar20;
              lVar23 = lVar23 + 0x30;
              if ((ulong)uVar36 * 0x30 == lVar23) goto LAB_00104d23;
            }
LAB_001053c2:
            stbi__free_jpeg_components(psVar16,uVar40,iVar11);
            stbi__g_failure_reason = "outofmem";
            goto LAB_00104b9a;
          }
LAB_00104d23:
          sVar35 = psVar42->img_y;
          psVar21 = (stbi_uc *)stbi__malloc_mad3(uVar14,sVar12,sVar35,1);
          iVar11 = (int)extraout_RDX_03;
          if (psVar21 == (stbi_uc *)0x0) goto LAB_001053c2;
          if (sVar35 != 0) {
            iVar32 = 0;
            uVar40 = 0;
            psVar26 = extraout_RDX_03;
            do {
              sVar12 = psVar42->img_x;
              if (0 < (int)uVar36) {
                piVar41 = local_d0;
                uVar28 = 0;
                piVar44 = &psVar16->img_comp[0].y;
                do {
                  iVar11 = piVar41[-1];
                  iVar39 = piVar41[-3];
                  iVar15 = iVar39 >> 1;
                  auVar46 = (**(code **)(piVar41 + -10))
                                      (*(stbi_uc **)(piVar44 + 10),
                                       *(undefined8 *)
                                        ((long)piVar41 +
                                        ((ulong)(iVar15 <= iVar11) << 3 | 0xffffffffffffffe0)),
                                       *(undefined8 *)
                                        ((long)piVar41 +
                                        ((ulong)(iVar11 < iVar15) << 3 | 0xffffffffffffffe0)),
                                       piVar41[-2],piVar41[-4]);
                  psVar26 = auVar46._8_8_;
                  local_158[uVar28] = auVar46._0_8_;
                  piVar41[-1] = iVar11 + 1;
                  if (iVar39 <= iVar11 + 1) {
                    piVar41[-1] = 0;
                    *(long *)(piVar41 + -8) = *(long *)(piVar41 + -6);
                    iVar11 = *piVar41;
                    *piVar41 = iVar11 + 1;
                    if (iVar11 + 1 < *piVar44) {
                      *(long *)(piVar41 + -6) = *(long *)(piVar41 + -6) + (long)piVar44[1];
                    }
                  }
                  uVar28 = uVar28 + 1;
                  piVar44 = piVar44 + 0x18;
                  piVar41 = piVar41 + 0xc;
                } while (uVar36 != uVar28);
              }
              if ((int)uVar14 < 3) {
                psVar42 = psVar16->s;
                if (bVar45) {
                  if (uVar14 == 1) {
                    if (psVar42->img_x != 0) {
                      uVar28 = 0;
                      do {
                        bVar10 = local_158[2][uVar28];
                        psVar21[uVar28 + sVar12 * iVar32] =
                             (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3 +
                                       (uint)local_158[1][uVar28] * 0x96 +
                                       (uint)local_158[0][uVar28] * 0x4d >> 8);
                        uVar28 = uVar28 + 1;
                        psVar26 = local_158[2];
                      } while (uVar28 < psVar42->img_x);
                    }
                  }
                  else if (psVar42->img_x != 0) {
                    uVar28 = 0;
                    do {
                      bVar10 = local_158[2][uVar28];
                      psVar21[uVar28 * 2 + (ulong)(sVar12 * iVar32)] =
                           (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3 +
                                     (uint)local_158[1][uVar28] * 0x96 +
                                     (uint)local_158[0][uVar28] * 0x4d >> 8);
                      psVar21[uVar28 * 2 + (ulong)(sVar12 * iVar32) + 1] = 0xff;
                      uVar28 = uVar28 + 1;
                      psVar26 = local_158[2];
                    } while (uVar28 < psVar42->img_x);
                  }
                }
                else if (psVar42->img_n == 4) {
                  if (psVar16->app14_color_transform == 2) {
                    if (psVar42->img_x != 0) {
                      psVar29 = psVar21 + (ulong)(sVar12 * iVar32) + 1;
                      psVar26 = (stbi_uc *)0x0;
                      do {
                        iVar11 = (local_158[0][(long)psVar26] ^ 0xff) * (uint)psVar26[local_140];
                        psVar29[-1] = (stbi_uc)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        *psVar29 = 0xff;
                        psVar26 = psVar26 + 1;
                        psVar29 = psVar29 + uVar14;
                      } while (psVar26 < (stbi_uc *)(ulong)psVar42->img_x);
                    }
                  }
                  else {
                    if (psVar16->app14_color_transform != 0) goto LAB_0010516b;
                    if (psVar42->img_x != 0) {
                      psVar29 = psVar21 + (ulong)(sVar12 * iVar32) + 1;
                      uVar28 = 0;
                      do {
                        bVar10 = *(byte *)(local_140 + uVar28);
                        iVar11 = (uint)local_158[0][uVar28] * (uint)bVar10;
                        iVar39 = (uint)local_158[1][uVar28] * (uint)bVar10;
                        psVar29[-1] = (stbi_uc)((((uint)local_158[2][uVar28] * (uint)bVar10 + 0x80
                                                 >> 8) + (uint)local_158[2][uVar28] * (uint)bVar10 +
                                                 0x80 >> 8) * 0x1d +
                                                (iVar39 + (iVar39 + 0x80U >> 8) + 0x80 >> 8) * 0x96
                                                + (iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8) *
                                                  0x4d >> 8);
                        *psVar29 = 0xff;
                        uVar28 = uVar28 + 1;
                        psVar29 = psVar29 + uVar14;
                        psVar26 = local_158[1];
                      } while (uVar28 < psVar42->img_x);
                    }
                  }
                }
                else {
LAB_0010516b:
                  if (uVar14 == 1) {
                    if (psVar42->img_x != 0) {
                      psVar29 = (stbi_uc *)0x0;
                      do {
                        (psVar21 + sVar12 * iVar32)[(long)psVar29] = local_158[0][(long)psVar29];
                        psVar29 = psVar29 + 1;
                        psVar26 = (stbi_uc *)(ulong)psVar42->img_x;
                      } while (psVar29 < (stbi_uc *)(ulong)psVar42->img_x);
                    }
                  }
                  else if (psVar42->img_x != 0) {
                    psVar29 = (stbi_uc *)0x0;
                    do {
                      psVar21[(long)psVar29 * 2 + (ulong)(sVar12 * iVar32)] =
                           local_158[0][(long)psVar29];
                      psVar21[(long)psVar29 * 2 + (ulong)(sVar12 * iVar32) + 1] = 0xff;
                      psVar29 = psVar29 + 1;
                      psVar26 = (stbi_uc *)(ulong)psVar42->img_x;
                    } while (psVar29 < (stbi_uc *)(ulong)psVar42->img_x);
                  }
                }
              }
              else {
                psVar42 = psVar16->s;
                if (psVar42->img_n == 3) {
                  if (bVar45) {
                    if (psVar42->img_x != 0) {
                      psVar29 = psVar21 + (ulong)(sVar12 * iVar32) + 3;
                      psVar26 = (stbi_uc *)0x0;
                      do {
                        psVar29[-3] = local_158[0][(long)psVar26];
                        psVar29[-2] = local_158[1][(long)psVar26];
                        psVar29[-1] = local_158[2][(long)psVar26];
                        *psVar29 = 0xff;
                        psVar26 = psVar26 + 1;
                        psVar29 = psVar29 + uVar14;
                      } while (psVar26 < (stbi_uc *)(ulong)psVar42->img_x);
                    }
                  }
                  else {
LAB_001051e0:
                    (*psVar16->YCbCr_to_RGB_kernel)
                              (psVar21 + uVar40 * uVar14 * sVar12,local_158[0],local_158[1],
                               local_158[2],psVar42->img_x,uVar14);
                    psVar42 = psVar16->s;
                    psVar26 = extraout_RDX_04;
                  }
                }
                else if (psVar42->img_n == 4) {
                  if (psVar16->app14_color_transform == 2) {
                    (*psVar16->YCbCr_to_RGB_kernel)
                              (psVar21 + uVar40 * uVar14 * sVar12,local_158[0],local_158[1],
                               local_158[2],psVar42->img_x,uVar14);
                    psVar42 = psVar16->s;
                    psVar26 = extraout_RDX_05;
                    if (psVar42->img_x != 0) {
                      pbVar30 = psVar21 + (ulong)(sVar12 * iVar32) + 2;
                      uVar28 = 0;
                      do {
                        bVar10 = *(byte *)(local_140 + uVar28);
                        iVar11 = (pbVar30[-2] ^ 0xff) * (uint)bVar10;
                        pbVar30[-2] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (pbVar30[-1] ^ 0xff) * (uint)bVar10;
                        pbVar30[-1] = (byte)(iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8);
                        iVar11 = (*pbVar30 ^ 0xff) * (uint)bVar10;
                        uVar24 = iVar11 + 0x80U >> 8;
                        *pbVar30 = (byte)(iVar11 + uVar24 + 0x80 >> 8);
                        uVar28 = uVar28 + 1;
                        pbVar30 = pbVar30 + uVar14;
                        psVar26 = (stbi_uc *)(ulong)uVar24;
                      } while (uVar28 < psVar42->img_x);
                    }
                  }
                  else {
                    if (psVar16->app14_color_transform != 0) goto LAB_001051e0;
                    if (psVar42->img_x != 0) {
                      psVar29 = psVar21 + (ulong)(sVar12 * iVar32) + 3;
                      uVar28 = 0;
                      do {
                        bVar10 = *(byte *)(local_140 + uVar28);
                        iVar11 = (uint)local_158[0][uVar28] * (uint)bVar10;
                        psVar29[-3] = (stbi_uc)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                        iVar11 = (uint)local_158[1][uVar28] * (uint)bVar10;
                        psVar29[-2] = (stbi_uc)(iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8);
                        psVar29[-1] = (stbi_uc)((uint)local_158[2][uVar28] * (uint)bVar10 +
                                                ((uint)local_158[2][uVar28] * (uint)bVar10 + 0x80 >>
                                                8) + 0x80 >> 8);
                        *psVar29 = 0xff;
                        uVar28 = uVar28 + 1;
                        psVar29 = psVar29 + uVar14;
                        psVar26 = local_158[2];
                      } while (uVar28 < psVar42->img_x);
                    }
                  }
                }
                else if (psVar42->img_x != 0) {
                  psVar29 = psVar21 + (ulong)(sVar12 * iVar32) + 3;
                  uVar28 = 0;
                  do {
                    sVar9 = local_158[0][uVar28];
                    psVar29[-1] = sVar9;
                    psVar29[-2] = sVar9;
                    psVar29[-3] = sVar9;
                    *psVar29 = 0xff;
                    uVar28 = uVar28 + 1;
                    psVar29 = psVar29 + uVar14;
                  } while (uVar28 < psVar42->img_x);
                }
              }
              iVar11 = (int)psVar26;
              uVar40 = uVar40 + 1;
              iVar32 = iVar32 + uVar14;
            } while (uVar40 < psVar42->img_y);
            uVar40 = psVar42->img_n;
          }
          stbi__free_jpeg_components(psVar16,uVar40,iVar11);
          psVar42 = psVar16->s;
          *local_128 = psVar42->img_x;
          *local_120 = psVar42->img_y;
          if (local_118 != (int *)0x0) {
            *local_118 = (uint)(2 < psVar42->img_n) * 2 + 1;
          }
          goto LAB_00104ba0;
        }
        iVar11 = stbi__process_marker(psVar16,uVar40);
        uVar40 = extraout_EDX_00;
        if (iVar11 != 0) goto LAB_00102da0;
      }
LAB_00104b8b:
      stbi__free_jpeg_components(psVar16,psVar16->s->img_n,uVar40);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00104b9a:
    psVar21 = (stbi_uc *)0x0;
LAB_00104ba0:
    free(psVar16);
  }
  else {
    iVar11 = stbi__check_png_header(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar11 == 0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if ((uint)req_comp < 5) {
        local_f8.s = s;
        iVar11 = stbi__parse_png_file(&local_f8,0,req_comp);
        psVar26 = local_f8.out;
        psVar42 = local_f8.s;
        if (iVar11 == 0) {
          psVar21 = (stbi_uc *)0x0;
        }
        else {
          iVar11 = 8;
          if (8 < local_f8.depth) {
            iVar11 = local_f8.depth;
          }
          ri->bits_per_channel = iVar11;
          local_f8.out = (stbi_uc *)0x0;
          psVar21 = psVar26;
          if ((req_comp != 0) && (iVar11 = (local_f8.s)->img_out_n, iVar11 != req_comp)) {
            sVar12 = (local_f8.s)->img_x;
            uVar40 = (local_f8.s)->img_y;
            if (local_f8.depth < 9) {
              psVar21 = (stbi_uc *)stbi__malloc_mad3(req_comp,sVar12,uVar40,0);
              if (psVar21 != (stbi_uc *)0x0) {
                if (0 < (int)uVar40) {
                  iVar39 = req_comp + iVar11 * 8;
                  iVar32 = sVar12 - 1;
                  uVar18 = 0;
                  uVar33 = 0;
                  uVar28 = 0;
                  do {
                    if (iVar39 - 10U < 0x1a) {
                      iVar15 = sVar12 * (int)uVar28;
                      pbVar30 = psVar26 + (uint)(iVar15 * iVar11);
                      switch(iVar39) {
                      case 10:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            psVar21[lVar23 * 2 + uVar18] = psVar26[lVar23 + uVar33];
                            psVar21[lVar23 * 2 + uVar18 + 1] = 0xff;
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0xb:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + uVar18 + 2;
                          lVar23 = 0;
                          do {
                            sVar9 = psVar26[lVar23 + uVar33];
                            *psVar29 = sVar9;
                            psVar29[-1] = sVar9;
                            psVar29[-2] = sVar9;
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0xc:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            sVar9 = psVar26[lVar23 + uVar33];
                            psVar21[lVar23 * 4 + uVar18 + 2] = sVar9;
                            psVar21[lVar23 * 4 + uVar18 + 1] = sVar9;
                            psVar21[lVar23 * 4 + uVar18] = sVar9;
                            psVar21[lVar23 * 4 + uVar18 + 3] = 0xff;
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x11:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            psVar21[lVar23 + uVar18] = psVar26[lVar23 * 2 + uVar33];
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x13:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + uVar18 + 2;
                          lVar23 = 0;
                          do {
                            sVar9 = psVar26[lVar23 * 2 + uVar33];
                            *psVar29 = sVar9;
                            psVar29[-1] = sVar9;
                            psVar29[-2] = sVar9;
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x14:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            sVar9 = psVar26[lVar23 * 2 + uVar33];
                            psVar21[lVar23 * 4 + uVar18 + 2] = sVar9;
                            psVar21[lVar23 * 4 + uVar18 + 1] = sVar9;
                            psVar21[lVar23 * 4 + uVar18] = sVar9;
                            psVar21[lVar23 * 4 + uVar18 + 3] = psVar26[lVar23 * 2 + uVar33 + 1];
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x19:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            bVar10 = pbVar30[2];
                            psVar21[lVar23 + uVar18] =
                                 (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3
                                           + (uint)pbVar30[1] * 0x96 + (uint)*pbVar30 * 0x4d >> 8);
                            lVar23 = lVar23 + 1;
                            pbVar30 = pbVar30 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x1a:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            bVar10 = pbVar30[2];
                            psVar21[lVar23 * 2 + uVar18] =
                                 (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3
                                           + (uint)pbVar30[1] * 0x96 + (uint)*pbVar30 * 0x4d >> 8);
                            psVar21[lVar23 * 2 + uVar18 + 1] = 0xff;
                            lVar23 = lVar23 + 1;
                            pbVar30 = pbVar30 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x1c:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            psVar21[lVar23 * 4 + uVar18] = *pbVar30;
                            psVar21[lVar23 * 4 + uVar18 + 1] = pbVar30[1];
                            psVar21[lVar23 * 4 + uVar18 + 2] = pbVar30[2];
                            psVar21[lVar23 * 4 + uVar18 + 3] = 0xff;
                            lVar23 = lVar23 + 1;
                            pbVar30 = pbVar30 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x21:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            bVar10 = psVar26[lVar23 * 4 + uVar33 + 2];
                            psVar21[lVar23 + uVar18] =
                                 (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3
                                           + (uint)psVar26[lVar23 * 4 + uVar33 + 1] * 0x96 +
                                             (uint)psVar26[lVar23 * 4 + uVar33] * 0x4d >> 8);
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x22:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            bVar10 = psVar26[lVar23 * 4 + uVar33 + 2];
                            psVar21[lVar23 * 2 + uVar18] =
                                 (stbi_uc)((uint)bVar10 * 2 + ((uint)bVar10 + (uint)bVar10 * 8) * 3
                                           + (uint)psVar26[lVar23 * 4 + uVar33 + 1] * 0x96 +
                                             (uint)psVar26[lVar23 * 4 + uVar33] * 0x4d >> 8);
                            psVar21[lVar23 * 2 + uVar18 + 1] = psVar26[lVar23 * 4 + uVar33 + 3];
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x23:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + (uint)(iVar15 * req_comp);
                          lVar23 = 0;
                          do {
                            *psVar29 = psVar26[lVar23 * 4 + uVar33];
                            psVar29[1] = psVar26[lVar23 * 4 + uVar33 + 1];
                            psVar29[2] = psVar26[lVar23 * 4 + uVar33 + 2];
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                      }
                    }
                    uVar28 = uVar28 + 1;
                    uVar33 = (ulong)((int)uVar33 + iVar11 * sVar12);
                    uVar18 = (ulong)((int)uVar18 + sVar12 * req_comp);
                  } while (uVar28 != uVar40);
                }
LAB_00104977:
                free(psVar26);
                psVar42->img_out_n = req_comp;
                goto LAB_0010498b;
              }
            }
            else {
              psVar21 = (stbi_uc *)malloc((ulong)(req_comp * sVar12 * uVar40 * 2));
              if (psVar21 != (stbi_uc *)0x0) {
                if (0 < (int)uVar40) {
                  iVar39 = req_comp + iVar11 * 8;
                  iVar32 = sVar12 - 1;
                  uVar28 = 0;
                  uVar18 = 0;
                  uVar33 = 0;
                  do {
                    if (iVar39 - 10U < 0x1a) {
                      iVar15 = (int)uVar33 * sVar12;
                      puVar38 = (ushort *)(psVar26 + (ulong)(uint)(iVar15 * iVar11) * 2);
                      switch(iVar39) {
                      case 10:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            *(undefined2 *)(psVar21 + lVar23 * 4 + uVar28 * 2) =
                                 *(undefined2 *)(psVar26 + lVar23 * 2 + uVar18 * 2);
                            (psVar21 + lVar23 * 4 + uVar28 * 2 + 2)[0] = 0xff;
                            (psVar21 + lVar23 * 4 + uVar28 * 2 + 2)[1] = 0xff;
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0xb:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + uVar28 * 2 + 4;
                          lVar23 = 0;
                          do {
                            uVar5 = *(undefined2 *)(psVar26 + lVar23 * 2 + uVar18 * 2);
                            *(undefined2 *)psVar29 = uVar5;
                            *(undefined2 *)(psVar29 + -2) = uVar5;
                            *(undefined2 *)(psVar29 + -4) = uVar5;
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 6;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0xc:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            auVar46._8_8_ = 0;
                            auVar46._0_8_ =
                                 (ulong)*(ushort *)(psVar26 + lVar23 * 2 + uVar18 * 2) | 0xffff0000;
                            auVar46 = pshuflw(auVar46,auVar46,0x40);
                            *(long *)(psVar21 + lVar23 * 8 + uVar28 * 2) = auVar46._0_8_;
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x11:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            *(undefined2 *)(psVar21 + lVar23 * 2 + uVar28 * 2) =
                                 *(undefined2 *)(psVar26 + lVar23 * 4 + uVar18 * 2);
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x13:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + uVar28 * 2 + 4;
                          lVar23 = 0;
                          do {
                            uVar5 = *(undefined2 *)(psVar26 + lVar23 * 4 + uVar18 * 2);
                            *(undefined2 *)psVar29 = uVar5;
                            *(undefined2 *)(psVar29 + -2) = uVar5;
                            *(undefined2 *)(psVar29 + -4) = uVar5;
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 6;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x14:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            auVar46 = pshuflw(ZEXT416(*(uint *)(psVar26 + lVar23 * 4 + uVar18 * 2)),
                                              ZEXT416(*(uint *)(psVar26 + lVar23 * 4 + uVar18 * 2)),
                                              0x40);
                            *(long *)(psVar21 + lVar23 * 8 + uVar28 * 2) = auVar46._0_8_;
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x19:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            uVar4 = puVar38[2];
                            *(short *)(psVar21 + lVar23 * 2 + uVar28 * 2) =
                                 (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                         (uint)puVar38[1] * 0x96 + (uint)*puVar38 * 0x4d >> 8);
                            lVar23 = lVar23 + 1;
                            puVar38 = puVar38 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x1a:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            uVar4 = puVar38[2];
                            *(short *)(psVar21 + lVar23 * 4 + uVar28 * 2) =
                                 (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                         (uint)puVar38[1] * 0x96 + (uint)*puVar38 * 0x4d >> 8);
                            (psVar21 + lVar23 * 4 + uVar28 * 2 + 2)[0] = 0xff;
                            (psVar21 + lVar23 * 4 + uVar28 * 2 + 2)[1] = 0xff;
                            lVar23 = lVar23 + 1;
                            puVar38 = puVar38 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x1c:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            *(undefined4 *)(psVar21 + lVar23 * 8 + uVar28 * 2) =
                                 *(undefined4 *)puVar38;
                            *(ushort *)(psVar21 + lVar23 * 8 + uVar28 * 2 + 4) = puVar38[2];
                            (psVar21 + lVar23 * 8 + uVar28 * 2 + 6)[0] = 0xff;
                            (psVar21 + lVar23 * 8 + uVar28 * 2 + 6)[1] = 0xff;
                            lVar23 = lVar23 + 1;
                            puVar38 = puVar38 + 3;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x21:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            uVar4 = *(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 4);
                            *(short *)(psVar21 + lVar23 * 2 + uVar28 * 2) =
                                 (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                         (uint)*(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 2) *
                                         0x96 + (uint)*(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2)
                                                * 0x4d >> 8);
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x22:
                        if (-1 < iVar32) {
                          lVar23 = 0;
                          do {
                            uVar4 = *(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 4);
                            *(short *)(psVar21 + lVar23 * 4 + uVar28 * 2) =
                                 (short)((uint)uVar4 * 2 + ((uint)uVar4 + (uint)uVar4 * 8) * 3 +
                                         (uint)*(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 2) *
                                         0x96 + (uint)*(ushort *)(psVar26 + lVar23 * 8 + uVar18 * 2)
                                                * 0x4d >> 8);
                            *(undefined2 *)(psVar21 + lVar23 * 4 + uVar28 * 2 + 2) =
                                 *(undefined2 *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 6);
                            lVar23 = lVar23 + 1;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                        break;
                      case 0x23:
                        if (-1 < iVar32) {
                          psVar29 = psVar21 + (ulong)(uint)(iVar15 * req_comp) * 2;
                          lVar23 = 0;
                          do {
                            *(undefined4 *)psVar29 =
                                 *(undefined4 *)(psVar26 + lVar23 * 8 + uVar18 * 2);
                            *(undefined2 *)(psVar29 + 4) =
                                 *(undefined2 *)(psVar26 + lVar23 * 8 + uVar18 * 2 + 4);
                            lVar23 = lVar23 + 1;
                            psVar29 = psVar29 + 6;
                          } while (sVar12 != (stbi__uint32)lVar23);
                        }
                      }
                    }
                    uVar33 = uVar33 + 1;
                    uVar18 = (ulong)((int)uVar18 + sVar12 * iVar11);
                    uVar28 = (ulong)((int)uVar28 + sVar12 * req_comp);
                  } while (uVar33 != uVar40);
                }
                goto LAB_00104977;
              }
            }
            free(psVar26);
            stbi__g_failure_reason = "outofmem";
            psVar42->img_out_n = req_comp;
            goto LAB_001041c8;
          }
LAB_0010498b:
          *local_128 = psVar42->img_x;
          *local_120 = psVar42->img_y;
          if (local_118 != (int *)0x0) {
            *local_118 = psVar42->img_n;
          }
          psVar26 = (stbi_uc *)0x0;
        }
        free(psVar26);
        free(local_f8.expanded);
        psVar16 = (stbi__jpeg *)local_f8.idata;
        goto LAB_00104ba0;
      }
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_001041c8:
    psVar21 = (stbi_uc *)0x0;
  }
  return psVar21;
LAB_0010407b:
  bVar45 = false;
LAB_0010407d:
  if (!bVar45) goto LAB_00104b8b;
LAB_00104085:
  bVar10 = psVar16->marker;
LAB_0010408d:
  if (bVar10 == 0xff) {
LAB_00104095:
    do {
      psVar42 = psVar16->s;
      if ((psVar42->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001040b5:
        if (psVar42->img_buffer_end <= psVar42->img_buffer) goto LAB_00102da0;
      }
      else {
        iVar11 = (*(psVar42->io).eof)(psVar42->io_user_data);
        if (iVar11 != 0) {
          if (psVar42->read_from_callbacks != 0) goto LAB_001040b5;
          goto LAB_00102da0;
        }
      }
      psVar42 = psVar16->s;
      psVar21 = psVar42->img_buffer;
      if (psVar21 < psVar42->img_buffer_end) {
        psVar42->img_buffer = psVar21 + 1;
        sVar9 = *psVar21;
      }
      else {
        if (psVar42->read_from_callbacks == 0) goto LAB_00104095;
        psVar21 = psVar42->buffer_start;
        iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
        if (iVar11 == 0) {
          psVar42->read_from_callbacks = 0;
          psVar26 = psVar42->buffer_start + 1;
          psVar42->buffer_start[0] = '\0';
          sVar9 = '\0';
        }
        else {
          psVar26 = psVar21 + iVar11;
          sVar9 = *psVar21;
        }
        psVar42->img_buffer_end = psVar26;
        psVar42->img_buffer = psVar42->buffer_start + 1;
      }
    } while (sVar9 != 0xff);
    psVar42 = psVar16->s;
    psVar21 = psVar42->img_buffer;
    if (psVar21 < psVar42->img_buffer_end) {
      psVar42->img_buffer = psVar21 + 1;
      sVar9 = *psVar21;
    }
    else if (psVar42->read_from_callbacks == 0) {
      sVar9 = '\0';
    }
    else {
      psVar21 = psVar42->buffer_start;
      iVar11 = (*(psVar42->io).read)(psVar42->io_user_data,(char *)psVar21,psVar42->buflen);
      if (iVar11 == 0) {
        psVar42->read_from_callbacks = 0;
        psVar26 = psVar42->buffer_start + 1;
        psVar42->buffer_start[0] = '\0';
        sVar9 = '\0';
      }
      else {
        psVar26 = psVar21 + iVar11;
        sVar9 = *psVar21;
      }
      psVar42->img_buffer_end = psVar26;
      psVar42->img_buffer = psVar42->buffer_start + 1;
    }
    psVar16->marker = sVar9;
  }
LAB_00102da0:
  bVar10 = stbi__get_marker(psVar16);
  goto LAB_00102d4a;
LAB_0010542e:
  paVar25 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar14 - 0x10);
  psVar16->code_bits = uVar14 - 0x10;
LAB_00105439:
  stbi__g_failure_reason = "bad huffman code";
LAB_00104b84:
  uVar40 = (uint)paVar25;
  goto LAB_00104b8b;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int /*bpc*/)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}